

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tick_log10.c
# Opt level: O0

double mpt_tick_log10(int val)

{
  double dStack_10;
  int val_local;
  
  if ((val < 2) || (9 < val)) {
    dStack_10 = NAN;
  }
  else {
    dStack_10 = mpt_tick_log10::logs[val];
  }
  return dStack_10;
}

Assistant:

extern double mpt_tick_log10(int val)
{
	static const double logs[8] = {
		0.3010299956639812,
		0.47712125471966244,
		0.6020599913279624,
		0.69897000433601886,
		0.77815125038364363,
		0.84509804001425681,
		0.90308998699194354,
		0.95424250943932487
	};
	if (val < 2 || val > 9) {
		return NAN;
	}
	return logs[val];
}